

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

int Pdr_SetIsInit(Pdr_Set_t *pCube,int iRemove)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  while( true ) {
    if ((long)pCube->nLits <= (long)uVar3) {
      return 1;
    }
    lVar2 = uVar3 * 4;
    if (*(uint *)(&pCube->field_0x14 + lVar2) == 0xffffffff) break;
    uVar1 = uVar3 + 1;
    bVar4 = (uint)iRemove != uVar3;
    uVar3 = uVar1;
    if ((bVar4) && ((*(uint *)(&pCube->field_0x14 + lVar2) & 1) == 0)) {
      return 0;
    }
  }
  __assert_fail("pCube->Lits[i] != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                ,0x15a,"int Pdr_SetIsInit(Pdr_Set_t *, int)");
}

Assistant:

int Pdr_SetIsInit( Pdr_Set_t * pCube, int iRemove )
{
    int i;
    for ( i = 0; i < pCube->nLits; i++ )
    {
        assert( pCube->Lits[i] != -1 );
        if ( i == iRemove )
            continue;
        if ( lit_sign( pCube->Lits[i] ) == 0 )
            return 0;
    }
    return 1;
}